

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O2

void restore_light_sources(memfile *mf,level *lev)

{
  int8_t iVar1;
  int16_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  ls_t *plVar5;
  
  for (iVar3 = mread32(mf); 0 < iVar3; iVar3 = iVar3 + -1) {
    plVar5 = (ls_t *)malloc(0x18);
    iVar4 = mread32(mf);
    plVar5->type = (short)iVar4;
    iVar2 = mread16(mf);
    plVar5->range = iVar2;
    iVar2 = mread16(mf);
    plVar5->flags = iVar2;
    iVar4 = mread32(mf);
    plVar5->id = (void *)(long)iVar4;
    iVar1 = mread8(mf);
    plVar5->x = iVar1;
    iVar1 = mread8(mf);
    plVar5->y = iVar1;
    plVar5->next = lev->lev_lights;
    lev->lev_lights = plVar5;
  }
  return;
}

Assistant:

void restore_light_sources(struct memfile *mf, struct level *lev)
{
    int count;
    long id;
    light_source *ls;

    /* restore elements */
    count = mread32(mf);

    while (count-- > 0) {
	ls = malloc(sizeof(light_source));
	ls->type = mread32(mf);
	ls->range = mread16(mf);
	ls->flags = mread16(mf);
	id = mread32(mf); /* prevent: "cast to pointer from integer of different size" */
	ls->id = (void*)id;
	ls->x = mread8(mf);
	ls->y = mread8(mf);
	
	ls->next = lev->lev_lights;
	lev->lev_lights = ls;
    }
}